

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

void __thiscall
QSocks5SocketEnginePrivate::_q_udpSocketReadNotification(QSocks5SocketEnginePrivate *this)

{
  QUdpSocket *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  qint64 qVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_c8;
  int local_ac;
  QArrayDataPointer<char> local_a8;
  QArrayDataPointer<char> local_88;
  undefined1 local_68 [48];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = QUdpSocket::hasPendingDatagrams(this->udpData->udpSocket);
  if (bVar4) {
    while( true ) {
      bVar4 = QUdpSocket::hasPendingDatagrams(this->udpData->udpSocket);
      if (!bVar4) break;
      local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.ptr = &DAT_aaaaaaaaaaaaaaaa;
      qVar6 = QUdpSocket::pendingDatagramSize(this->udpData->udpSocket);
      QByteArray::QByteArray((QByteArray *)&local_88,qVar6,'\0');
      this_00 = this->udpData->udpSocket;
      pcVar7 = QByteArray::data((QByteArray *)&local_88);
      QUdpSocket::readDatagram(this_00,pcVar7,local_88.size,(QHostAddress *)0x0,(quint16 *)0x0);
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (char *)0x0;
      local_a8.size = 0;
      QByteArray::operator=((QByteArray *)&local_a8,(QByteArray *)&local_88);
      pcVar7 = local_a8.ptr;
      if (local_a8.ptr == (char *)0x0) {
        pcVar7 = (char *)&QByteArray::_empty;
      }
      if ((ulong)local_a8.size < 4) {
LAB_00220eda:
        QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
        goto LAB_00220eee;
      }
      local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QSocks5RevivedDatagram::QSocks5RevivedDatagram((QSocks5RevivedDatagram *)local_68);
      if (((*pcVar7 != '\0') || (pcVar7[1] != '\0')) || (local_ac = 3, pcVar7[2] != '\0')) {
LAB_00220ed0:
        QSocks5RevivedDatagram::~QSocks5RevivedDatagram((QSocks5RevivedDatagram *)local_68);
        goto LAB_00220eda;
      }
      iVar5 = qt_socks5_get_host_address_and_port
                        ((QByteArray *)&local_a8,(QHostAddress *)(local_68 + 0x18),
                         (quint16 *)(local_68 + 0x20),&local_ac);
      if (iVar5 != 1) goto LAB_00220ed0;
      QByteArray::QByteArray((QByteArray *)&local_c8,pcVar7 + local_ac,local_a8.size - local_ac);
      uVar3 = local_68._16_8_;
      uVar2 = local_68._8_8_;
      uVar1 = local_68._0_8_;
      local_68._0_8_ = local_c8.d;
      local_68._8_8_ = local_c8.ptr;
      local_c8.d = (Data *)uVar1;
      local_c8.ptr = (char *)uVar2;
      local_68._16_8_ = local_c8.size;
      local_c8.size = uVar3;
      QArrayDataPointer<char>::~QArrayDataPointer(&local_c8);
      QList<QSocks5RevivedDatagram>::emplaceBack<QSocks5RevivedDatagram_const&>
                (&(this->udpData->pendingDatagrams).super_QList<QSocks5RevivedDatagram>,
                 (QSocks5RevivedDatagram *)local_68);
      QSocks5RevivedDatagram::~QSocks5RevivedDatagram((QSocks5RevivedDatagram *)local_68);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
    }
    emitReadNotification(this);
  }
LAB_00220eee:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSocks5SocketEnginePrivate::_q_udpSocketReadNotification()
{
    QSOCKS5_D_DEBUG << "_q_udpSocketReadNotification()";

    // check some state stuff
    if (!udpData->udpSocket->hasPendingDatagrams()) {
        QSOCKS5_D_DEBUG << "false read ??";
        return;
    }

    while (udpData->udpSocket->hasPendingDatagrams()) {
        QByteArray sealedBuf(udpData->udpSocket->pendingDatagramSize(), 0);
        QSOCKS5_D_DEBUG << "new datagram";
        udpData->udpSocket->readDatagram(sealedBuf.data(), sealedBuf.size());
        QByteArray inBuf;
        if (!data->authenticator->unSeal(sealedBuf, &inBuf)) {
            QSOCKS5_D_DEBUG << "failed unsealing datagram discarding";
            return;
        }
        QSOCKS5_DEBUG << dump(inBuf);
        int pos = 0;
        const char *buf = inBuf.constData();
        if (inBuf.size() < 4) {
            QSOCKS5_D_DEBUG << "bogus udp data, discarding";
            return;
        }
        QSocks5RevivedDatagram datagram;
        if (buf[pos++] != 0 || buf[pos++] != 0) {
            QSOCKS5_D_DEBUG << "invalid datagram discarding";
            return;
        }
        if (buf[pos++] != 0) { //### add fragmentation reading support
            QSOCKS5_D_DEBUG << "don't support fragmentation yet disgarding";
            return;
        }
        if (qt_socks5_get_host_address_and_port(inBuf, &datagram.address, &datagram.port, &pos) != 1) {
            QSOCKS5_D_DEBUG << "failed to get address from datagram disgarding";
            return;
        }
        datagram.data = QByteArray(&buf[pos], inBuf.size() - pos);
        udpData->pendingDatagrams.enqueue(datagram);
    }
    emitReadNotification();
}